

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  pointer *pppcVar1;
  iterator __position;
  pointer pbVar2;
  int iVar3;
  size_type sVar4;
  pointer pbVar5;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var6;
  string_view arg;
  cmBTStringRange cVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string objLibName;
  cmGeneratorTarget *objLib;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_80;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  cmGeneratorTarget *local_58;
  cmGeneratorTarget *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_58 = this;
  cVar7 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  if (cVar7.Begin._M_current._M_current != cVar7.End._M_current._M_current) {
    do {
      local_60 = cVar7.End._M_current;
      _Var6 = cVar7.Begin._M_current;
      arg._M_str = ((_Var6._M_current)->Value)._M_dataplus._M_p;
      arg._M_len = ((_Var6._M_current)->Value)._M_string_length;
      cmExpandedList_abi_cxx11_(&local_48,arg,false);
      pbVar2 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1
          ) {
        local_80._M_string_length = (size_type)(pbVar5->_M_dataplus)._M_p;
        local_80._M_dataplus._M_p = (pointer)pbVar5->_M_string_length;
        __str._M_str = "$<TARGET_OBJECTS:";
        __str._M_len = 0x11;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_80,0,0x11,
                           __str);
        if ((iVar3 == 0) && ((pbVar5->_M_dataplus)._M_p[pbVar5->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_80,(ulong)pbVar5);
          sVar4 = cmGeneratorExpression::Find(&local_80);
          if (sVar4 == 0xffffffffffffffff) {
            local_50 = cmLocalGenerator::FindGeneratorTargetToUse
                                 (local_58->LocalGenerator,&local_80);
            if (local_50 != (cmGeneratorTarget *)0x0) {
              __position._M_current =
                   (objlibs->
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (objlibs->
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
                _M_realloc_insert<cmGeneratorTarget*const&>
                          ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)objlibs,
                           __position,&local_50);
              }
              else {
                *__position._M_current = local_50;
                pppcVar1 = &(objlibs->
                            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      cVar7.End._M_current = local_60._M_current;
      cVar7.Begin._M_current = _Var6._M_current + 1;
    } while (_Var6._M_current + 1 != local_60._M_current);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmBTStringRange rng = this->Target->GetSourceEntries();
  for (auto const& entry : rng) {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    for (std::string const& li : files) {
      if (cmHasLiteralPrefix(li, "$<TARGET_OBJECTS:") && li.back() == '>') {
        std::string objLibName = li.substr(17, li.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}